

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O3

void __thiscall
Assimp::ZipArchiveIOSystem::Implement::Implement
          (Implement *this,IOSystem *pIOHandler,char *pFilename,char *pMode)

{
  unzFile pvVar1;
  _Rb_tree_header *p_Var2;
  zlib_filefunc_def mapping;
  code *local_50;
  code *local_48;
  code *local_40;
  code *local_38;
  code *local_30;
  code *local_28;
  code *local_20;
  IOSystem *local_18;
  
  this->m_ZipFileHandle = (unzFile)0x0;
  p_Var2 = &(this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((*pMode == 'r') && (pMode[1] == '\0')) {
    if (pFilename != (char *)0x0) {
      if (*pFilename != '\0') {
        local_50 = IOSystem2Unzip::open;
        local_48 = IOSystem2Unzip::read;
        local_40 = IOSystem2Unzip::write;
        local_38 = IOSystem2Unzip::tell;
        local_30 = IOSystem2Unzip::seek;
        local_28 = IOSystem2Unzip::close;
        local_20 = IOSystem2Unzip::testerror;
        local_18 = pIOHandler;
        pvVar1 = (unzFile)unzOpen2(pFilename,&local_50);
        this->m_ZipFileHandle = pvVar1;
      }
      return;
    }
    __assert_fail("pFilename != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                  ,0x151,
                  "Assimp::ZipArchiveIOSystem::Implement::Implement(IOSystem *, const char *, const char *)"
                 );
  }
  __assert_fail("strcmp(pMode, \"r\") == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                ,0x150,
                "Assimp::ZipArchiveIOSystem::Implement::Implement(IOSystem *, const char *, const char *)"
               );
}

Assistant:

ZipArchiveIOSystem::Implement::Implement(IOSystem* pIOHandler, const char* pFilename, const char* pMode) {
        ai_assert(strcmp(pMode, "r") == 0);
        ai_assert(pFilename != nullptr);
        if (pFilename[0] == 0)
            return;

        zlib_filefunc_def mapping = IOSystem2Unzip::get(pIOHandler);
        m_ZipFileHandle = unzOpen2(pFilename, &mapping);
    }